

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O2

void __thiscall chrono::ChLinkClearance::UpdateForces(ChLinkClearance *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  Vector temp;
  ChVector<double> result;
  Vector m_V2_abs;
  Vector m_V1_abs;
  Vector pb2;
  Vector pb1;
  ChVector<double> local_138;
  double local_118;
  undefined8 uStack_110;
  Vector local_108;
  Vector local_e8;
  undefined1 local_c8 [16];
  double local_b8;
  undefined1 local_a8 [16];
  double local_98;
  undefined1 local_88 [16];
  double local_78;
  Vector local_68;
  ChVector<double> local_50;
  ChVector<double> local_38;
  
  local_138.m_data[0] = VNULL;
  local_138.m_data[1] = DAT_011dd3e0;
  local_138.m_data[2] = DAT_011dd3e8;
  local_118 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
              react_force.m_data[0];
  uStack_110 = 0;
  if (((*(this->super_ChLinkLockLock).super_ChLinkLock.mask.super_ChLinkMask.constraints.
         super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).super_ChConstraint.
      active == true) {
    Get_contact_P_abs(&local_e8,this);
    ChFrame<double>::TransformParentToLocal
              (&local_38,
               (ChFrame<double> *)
               (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1,
               &local_e8);
    ChFrame<double>::TransformParentToLocal
              (&local_50,
               (ChFrame<double> *)
               (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2,
               &local_e8);
    ChFrameMoving<double>::PointSpeedLocalToParent
              ((ChVector<double> *)local_88,
               &((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
                Body1)->super_ChFrameMoving<double>,&local_38);
    ChFrameMoving<double>::PointSpeedLocalToParent
              ((ChVector<double> *)local_a8,
               &((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
                Body2)->super_ChFrameMoving<double>,&local_50);
    auVar3 = vsubpd_avx(local_88,local_a8);
    *(undefined1 (*) [16])(this->contact_V_abs).m_data = auVar3;
    (this->contact_V_abs).m_data[2] = local_78 - local_98;
    Get_contact_N_abs(&local_108,this);
    Get_contact_N_abs(&local_68,this);
    auVar3 = *(undefined1 (*) [16])(this->contact_V_abs).m_data;
    local_b8 = (this->contact_V_abs).m_data[2];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_b8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_68.m_data[0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->contact_V_abs).m_data[1] * local_68.m_data[1];
    auVar1 = vfmadd132sd_fma(auVar3,auVar5,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_68.m_data[2];
    auVar1 = vfmadd231sd_fma(auVar1,auVar4,auVar2);
    dVar8 = auVar1._0_8_;
    auVar6._0_8_ = dVar8 * local_108.m_data[0];
    auVar6._8_8_ = dVar8 * local_108.m_data[1];
    local_c8 = vsubpd_avx(auVar3,auVar6);
    local_b8 = local_b8 - dVar8 * local_108.m_data[2];
    Vnorm<double>(&local_108,(ChVector<double> *)local_c8);
    local_138.m_data[1] = local_118 * this->c_friction;
    local_138.m_data[2] = local_138.m_data[1] * local_108.m_data[2];
    local_138.m_data[0] = local_138.m_data[1] * local_108.m_data[0];
    local_138.m_data[1] = local_138.m_data[1] * local_108.m_data[1];
    ChMarker::Dir_World2Ref
              (&local_108,(this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,
               &local_138);
    ChVector<double>::operator+=
              (&(this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force,&local_108
              );
  }
  Get_contact_N_abs(&local_e8,this);
  auVar7._0_8_ = local_118 * local_e8.m_data[0];
  auVar7._8_8_ = local_118 * local_e8.m_data[1];
  auVar3._8_8_ = local_138.m_data[1];
  auVar3._0_8_ = local_138.m_data[0];
  auVar3 = vsubpd_avx(auVar3,auVar7);
  *(undefined1 (*) [16])(this->contact_F_abs).m_data = auVar3;
  (this->contact_F_abs).m_data[2] = local_138.m_data[2] - local_118 * local_e8.m_data[2];
  return;
}

Assistant:

void ChLinkClearance::UpdateForces(double mytime) {
    // May avoid inheriting parent class force computation, since not
    // needed...
    // LinkLock::UpdateForces(mytime);

    Vector m_friction_F_abs = VNULL;
    double m_norm_force = -this->react_force.x();

    // Just add Coulomb kinematic friction...

    if (mask.Constr_X().IsActive()) {
        Vector temp = Get_contact_P_abs();
        Vector pb1 = ((ChFrame<double>*)Body1)->TransformParentToLocal(temp);
        Vector pb2 = ((ChFrame<double>*)Body2)->TransformParentToLocal(temp);
        Vector m_V1_abs = Body1->PointSpeedLocalToParent(pb1);
        Vector m_V2_abs = Body2->PointSpeedLocalToParent(pb2);
        this->contact_V_abs = Vsub(m_V1_abs, m_V2_abs);
        Vector m_tang_V_abs = Vsub(contact_V_abs, Vmul(Get_contact_N_abs(), Vdot(contact_V_abs, Get_contact_N_abs())));

        // absolute friction force, as applied in contact point
        m_friction_F_abs = Vmul(Vnorm(m_tang_V_abs), Get_c_friction() * (-m_norm_force));

        // transform the friction force in link master coords ***TO CHECK*** (new version!)
        this->C_force += this->marker2->Dir_World2Ref(m_friction_F_abs);
    }

    // update internal data: the abs. vector of all contact forces, is a sum of reaction and friction
    this->contact_F_abs = Vadd(Vmul(Get_contact_N_abs(), m_norm_force), m_friction_F_abs);
}